

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O0

int CheckFromArray(void)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  int local_20;
  int n;
  int i;
  int passed;
  FILE *out;
  
  _i = fopen("out.txt","r");
  n = 1;
  if (_i == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    for (local_20 = 0; local_20 < testInOut[testN].n; local_20 = local_20 + 1) {
      pcVar2 = ScanInt((FILE *)_i,&local_24);
      if ((pcVar2 != "PASSED") ||
         (*(int *)((long)testN * 0x110 + 0x106cdc + (long)local_20 * 4) != local_24)) {
        n = 0;
        printf("wrong output -- ");
        break;
      }
    }
    if (n != 0) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)_i);
      n = (int)((iVar1 != 0 ^ 0xffU) & 1);
    }
    fclose(_i);
    if (n == 0) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }
    for (int i = 0; i < testInOut[testN].n; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
        ++testN;
        return 1;
    }
}